

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindDecimalRoundPrecision
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalType *other;
  Expression EVar1;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> _Var2;
  char cVar3;
  uchar uVar4;
  byte bVar5;
  uint val_00;
  reference pvVar6;
  pointer pEVar7;
  pointer pEVar8;
  type pEVar9;
  reference this_00;
  ParameterNotResolvedException *this_01;
  NotImplementedException *pNVar10;
  code *pcVar11;
  int32_t round_value;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_b8;
  undefined8 local_b0 [8];
  Value val;
  char local_58;
  
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  cVar3 = (**(code **)(*(long *)pEVar8 + 0x30))(pEVar8);
  if (cVar3 != '\0') {
    this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    duckdb::ParameterNotResolvedException::ParameterNotResolvedException(this_01);
    __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,std::runtime_error::~runtime_error)
    ;
  }
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  cVar3 = (**(code **)(*(long *)pEVar8 + 0x78))(pEVar8);
  if (cVar3 != '\0') {
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,1);
    pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar6);
    duckdb::ExpressionExecutor::EvaluateScalar
              ((ClientContext *)local_b0,(Expression *)context,SUB81(pEVar9,0));
    duckdb::LogicalType::LogicalType((LogicalType *)&round_value,INTEGER);
    duckdb::Value::DefaultCastAs((LogicalType *)&val,SUB81(local_b0,0));
    duckdb::LogicalType::~LogicalType((LogicalType *)&round_value);
    duckdb::Value::~Value((Value *)local_b0);
    if (local_58 != '\x01') {
      local_b8._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
      super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
           (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
           (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
      val_00 = duckdb::IntegerValue::Get(&val);
      other = (LogicalType *)(pEVar7 + 0x38);
      round_value = val_00;
      uVar4 = duckdb::DecimalType::GetWidth(other);
      bVar5 = duckdb::DecimalType::GetScale(other);
      if ((int)val_00 < 0) {
        EVar1 = pEVar7[0x39];
        if (EVar1 == (Expression)0x5) {
          pcVar11 = DecimalRoundNegativePrecisionFunction<short,duckdb::NumericHelper>;
        }
        else if (EVar1 == (Expression)0x7) {
          pcVar11 = DecimalRoundNegativePrecisionFunction<int,duckdb::NumericHelper>;
        }
        else if (EVar1 == (Expression)0x9) {
          pcVar11 = DecimalRoundNegativePrecisionFunction<long,duckdb::NumericHelper>;
        }
        else {
          pcVar11 = DecimalRoundNegativePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>;
        }
        std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                  ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                   &bound_function->function,pcVar11);
      }
      else {
        if (val_00 < bVar5) {
          NumericCastImpl<unsigned_char,_int,_false>::Convert(val_00);
          EVar1 = pEVar7[0x39];
          if (EVar1 == (Expression)0x9) {
            pcVar11 = DecimalRoundPositivePrecisionFunction<long,duckdb::NumericHelper>;
          }
          else if (EVar1 == (Expression)0x7) {
            pcVar11 = DecimalRoundPositivePrecisionFunction<int,duckdb::NumericHelper>;
          }
          else if (EVar1 == (Expression)0x5) {
            pcVar11 = DecimalRoundPositivePrecisionFunction<short,duckdb::NumericHelper>;
          }
          else {
            pcVar11 = DecimalRoundPositivePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>;
          }
        }
        else {
          pcVar11 = duckdb::ScalarFunction::NopFunction;
        }
        std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                  ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                   &bound_function->function,pcVar11);
      }
      this_00 = vector<duckdb::LogicalType,_true>::get<true>
                          ((vector<duckdb::LogicalType,_true> *)&bound_function->field_0x48,0);
      LogicalType::operator=(this_00,other);
      duckdb::LogicalType::DECIMAL((uchar)local_b0,uVar4);
      LogicalType::operator=((LogicalType *)&bound_function->field_0x90,(LogicalType *)local_b0);
      duckdb::LogicalType::~LogicalType((LogicalType *)local_b0);
      make_uniq<duckdb::RoundPrecisionFunctionData,int&>((duckdb *)local_b0,&round_value);
      _Var2._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
      super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
           local_b8._M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
           .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
      *(undefined8 *)
       local_b8._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = local_b0[0];
      duckdb::Value::~Value(&val);
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
             _Var2._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    }
    pNVar10 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)local_b0,
               "ROUND(DECIMAL, INTEGER) with non-constant precision is not supported",
               (allocator *)&round_value);
    duckdb::NotImplementedException::NotImplementedException(pNVar10,(string *)local_b0);
    __cxa_throw(pNVar10,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
  }
  pNVar10 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&val,"ROUND(DECIMAL, INTEGER) with non-constant precision is not supported",
             (allocator *)local_b0);
  duckdb::NotImplementedException::NotImplementedException(pNVar10,(string *)&val);
  __cxa_throw(pNVar10,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> BindDecimalRoundPrecision(ClientContext &context, ScalarFunction &bound_function,
                                                   vector<unique_ptr<Expression>> &arguments) {
	auto &decimal_type = arguments[0]->return_type;
	if (arguments[1]->HasParameter()) {
		throw ParameterNotResolvedException();
	}
	if (!arguments[1]->IsFoldable()) {
		throw NotImplementedException("ROUND(DECIMAL, INTEGER) with non-constant precision is not supported");
	}
	Value val = ExpressionExecutor::EvaluateScalar(context, *arguments[1]).DefaultCastAs(LogicalType::INTEGER);
	if (val.IsNull()) {
		throw NotImplementedException("ROUND(DECIMAL, INTEGER) with non-constant precision is not supported");
	}
	// our new precision becomes the round value
	// e.g. ROUND(DECIMAL(18,3), 1) -> DECIMAL(18,1)
	// but ONLY if the round value is positive
	// if it is negative the scale becomes zero
	// i.e. ROUND(DECIMAL(18,3), -1) -> DECIMAL(18,0)
	int32_t round_value = IntegerValue::Get(val);
	uint8_t target_scale;
	auto width = DecimalType::GetWidth(decimal_type);
	auto scale = DecimalType::GetScale(decimal_type);
	if (round_value < 0) {
		target_scale = 0;
		switch (decimal_type.InternalType()) {
		case PhysicalType::INT16:
			bound_function.function = DecimalRoundNegativePrecisionFunction<int16_t, NumericHelper>;
			break;
		case PhysicalType::INT32:
			bound_function.function = DecimalRoundNegativePrecisionFunction<int32_t, NumericHelper>;
			break;
		case PhysicalType::INT64:
			bound_function.function = DecimalRoundNegativePrecisionFunction<int64_t, NumericHelper>;
			break;
		default:
			bound_function.function = DecimalRoundNegativePrecisionFunction<hugeint_t, Hugeint>;
			break;
		}
	} else {
		if (round_value >= (int32_t)scale) {
			// if round_value is bigger than or equal to scale we do nothing
			bound_function.function = ScalarFunction::NopFunction;
			target_scale = scale;
		} else {
			target_scale = NumericCast<uint8_t>(round_value);
			switch (decimal_type.InternalType()) {
			case PhysicalType::INT16:
				bound_function.function = DecimalRoundPositivePrecisionFunction<int16_t, NumericHelper>;
				break;
			case PhysicalType::INT32:
				bound_function.function = DecimalRoundPositivePrecisionFunction<int32_t, NumericHelper>;
				break;
			case PhysicalType::INT64:
				bound_function.function = DecimalRoundPositivePrecisionFunction<int64_t, NumericHelper>;
				break;
			default:
				bound_function.function = DecimalRoundPositivePrecisionFunction<hugeint_t, Hugeint>;
				break;
			}
		}
	}
	bound_function.arguments[0] = decimal_type;
	bound_function.return_type = LogicalType::DECIMAL(width, target_scale);
	return make_uniq<RoundPrecisionFunctionData>(round_value);
}